

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void __thiscall asl::Log::Log(Log *this)

{
  Mutex *pMVar1;
  
  (this->_logfile).field_2._space[0] = '\0';
  (this->_logfile)._size = 0;
  (this->_logfile)._len = 0;
  String::assign(&this->_logfile,"log.log",7);
  this->_useconsole = true;
  this->_usefile = true;
  this->_maxLevel = 2;
  pMVar1 = (Mutex *)operator_new(0x28);
  *(undefined8 *)((long)&pMVar1->_mutex + 0x10) = 0;
  (pMVar1->_mutex).__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pMVar1->_mutex).__align = 0;
  *(undefined8 *)((long)&pMVar1->_mutex + 8) = 0;
  (pMVar1->_mutex).__data.__list.__next = (__pthread_internal_list *)0x0;
  this->_mutex = pMVar1;
  return;
}

Assistant:

Log::Log()
{
	_logfile = "log.log";
	_useconsole = true;
	_usefile = true;
	_maxLevel = 2;
	_mutex = new Mutex;
}